

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufCreateEdges(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int Entry;
  Mio_Gate_t *pGate;
  int iPin;
  float fVar1;
  
  iPin = 0;
  if ((*(uint *)&pObj->field_0x14 & 0xf) - 5 < 0xfffffffe) {
    pGate = (Mio_Gate_t *)(pObj->field_5).pData;
  }
  else {
    pGate = (Mio_Gate_t *)0x0;
  }
  Vec_IntWriteEntry(p->vOffsets,pObj->Id,p->vEdges->nSize);
  for (; iPin < (pObj->vFanins).nSize; iPin = iPin + 1) {
    p_00 = p->vEdges;
    if (pGate == (Mio_Gate_t *)0x0) {
      Entry = 0;
    }
    else {
      fVar1 = Mio_GateReadPinDelay(pGate,iPin);
      Entry = (int)((fVar1 * 1000.0) / p->DelayInv);
    }
    Vec_IntPush(p_00,Entry);
  }
  return;
}

Assistant:

void Abc_BufCreateEdges( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    int k;
    Mio_Gate_t * pGate = Abc_ObjIsCo(pObj) ? NULL : (Mio_Gate_t *)pObj->pData;
    Vec_IntWriteEntry( p->vOffsets, Abc_ObjId(pObj), Vec_IntSize(p->vEdges) );
    for ( k = 0; k < Abc_ObjFaninNum(pObj); k++ )
        Vec_IntPush( p->vEdges, pGate ? (int)(1.0 * BUF_SCALE * Mio_GateReadPinDelay(pGate, k) / p->DelayInv) : 0 );
}